

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baseapp.hpp
# Opt level: O3

void __thiscall piksel::BaseApp::BaseApp(BaseApp *this,int width,int height)

{
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"piksel","");
  BaseApp(this,width,height,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

BaseApp(int width, int height) : BaseApp(width, height, "piksel") {
    }